

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O1

int nni_listener_hold(nni_listener *l)

{
  int iVar1;
  
  nni_mtx_lock(&listeners_lk);
  iVar1 = 7;
  if (l->l_closed == false) {
    l->l_ref = l->l_ref + 1;
    iVar1 = 0;
  }
  nni_mtx_unlock(&listeners_lk);
  return iVar1;
}

Assistant:

int
nni_listener_hold(nni_listener *l)
{
	int rv;
	nni_mtx_lock(&listeners_lk);
	if (l->l_closed) {
		rv = NNG_ECLOSED;
	} else {
		l->l_ref++;
		rv = 0;
	}
	nni_mtx_unlock(&listeners_lk);
	return (rv);
}